

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt tt_cmap14_char_map_nondef_binary(FT_Byte *base,FT_UInt32 char_code)

{
  bool bVar1;
  uint in_EAX;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = *(uint *)base;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar5 = 0;
  do {
    if (uVar2 <= uVar5) {
      return 0;
    }
    uVar4 = uVar5 + uVar2 >> 1;
    uVar6 = (ulong)(uVar4 * 5);
    uVar3 = (uint)base[uVar6 + 6] | (uint)base[uVar6 + 5] << 8 | (uint)base[uVar6 + 4] << 0x10;
    bVar1 = true;
    if (uVar3 <= char_code) {
      if (uVar3 < char_code) {
        uVar5 = uVar4 + 1;
        uVar4 = uVar2;
      }
      else {
        in_EAX = (uint)(ushort)(*(ushort *)(base + uVar6 + 7) << 8 |
                               *(ushort *)(base + uVar6 + 7) >> 8);
        bVar1 = false;
        uVar4 = uVar2;
      }
    }
    uVar2 = uVar4;
  } while (bVar1);
  return in_EAX;
}

Assistant:

static FT_UInt
  tt_cmap14_char_map_nondef_binary( FT_Byte    *base,
                                    FT_UInt32   char_code )
  {
    FT_UInt32  numMappings = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numMappings;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid = ( min + max ) >> 1;
      FT_Byte*   p   = base + 5 * mid;
      FT_UInt32  uni = (FT_UInt32)TT_NEXT_UINT24( p );


      if ( char_code < uni )
        max = mid;
      else if ( char_code > uni )
        min = mid + 1;
      else
        return TT_PEEK_USHORT( p );
    }

    return 0;
  }